

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O3

void __thiscall
cfd::core::ExtPubkey::ExtPubkey
          (ExtPubkey *this,NetType network_type,Pubkey *parent_key,ByteData256 *parent_chain_code,
          uint8_t parent_depth,uint32_t child_num)

{
  pointer puVar1;
  bool bVar2;
  value_type_conflict1 *__val;
  CfdException *pCVar3;
  undefined4 uVar4;
  int ret;
  string local_278;
  Pubkey local_258;
  Pubkey *local_238;
  ByteData256 *local_230;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_228;
  ByteData256 *local_208;
  vector<unsigned_char,_std::allocator<unsigned_char>_> chain_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey_hash;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey_bytes;
  string local_1b8;
  uint8_t local_184;
  undefined1 local_179;
  undefined1 local_154 [20];
  undefined4 local_140;
  undefined1 local_139 [73];
  ByteData local_f0 [8];
  
  ByteData::ByteData(&this->serialize_data_);
  this->child_num_ = 0;
  local_230 = &this->chaincode_;
  this->version_ = 0;
  this->fingerprint_ = 0;
  this->depth_ = '\0';
  ByteData256::ByteData256(local_230);
  local_238 = &this->pubkey_;
  Pubkey::Pubkey(local_238);
  local_208 = &this->tweak_sum_;
  ByteData256::ByteData256(local_208);
  bVar2 = Pubkey::IsValid(parent_key);
  if (!bVar2) {
    local_1b8._M_dataplus._M_p = "cfdcore_hdwallet.cpp";
    local_1b8._M_string_length = CONCAT44(local_1b8._M_string_length._4_4_,0x339);
    local_1b8.field_2._M_allocated_capacity = (long)"GetExtPubkey" + 3;
    logger::log<>((CfdSourceLocation *)&local_1b8,kCfdLogLevelWarning,"invalid pubkey.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b8,"Failed to pubkey. ExtPubkey invalid pubkey.","");
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&local_1b8);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_258,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)parent_key);
  bVar2 = Pubkey::IsCompress(&local_258);
  if (!bVar2) {
    Pubkey::Compress((Pubkey *)&local_1b8,&local_258);
    puVar1 = local_258.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_258.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_1b8._M_dataplus._M_p;
    local_258.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_1b8._M_string_length;
    local_258.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_1b8.field_2._M_allocated_capacity;
    local_1b8._M_dataplus._M_p = (pointer)0x0;
    local_1b8._M_string_length = 0;
    local_1b8.field_2._M_allocated_capacity = 0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
      if ((pointer)local_1b8._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_1b8._M_dataplus._M_p);
      }
    }
  }
  uVar4 = 0x43587cf;
  if (network_type == kMainnet) {
    uVar4 = 0x488b21e;
  }
  if (network_type == kLiquidV1) {
    uVar4 = 0x488b21e;
  }
  memset(&local_1b8,0,0xc0);
  local_179 = 1;
  local_184 = parent_depth;
  local_140 = uVar4;
  Pubkey::GetData(local_f0,&local_258);
  ByteData::GetBytes(&pubkey_bytes,local_f0);
  if (local_f0[0].data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0[0].data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  HashUtil::Hash160((ByteData160 *)local_f0,&local_258);
  ByteData160::GetBytes(&pubkey_hash,(ByteData160 *)local_f0);
  if (local_f0[0].data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0[0].data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  ByteData256::GetData(local_f0,parent_chain_code);
  ByteData::GetBytes(&chain_bytes,local_f0);
  if (local_f0[0].data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0[0].data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  memcpy(local_139,
         pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start,
         (long)pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start);
  memcpy(local_154,
         pubkey_hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start,
         (long)pubkey_hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_finish -
         (long)pubkey_hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_start);
  memcpy(&local_1b8,
         chain_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start,
         (long)chain_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_finish -
         (long)chain_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_start);
  memset(local_f0,0,0xc0);
  ret = bip32_key_from_parent(&local_1b8,child_num,1,local_f0);
  if (ret == 0) {
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(0x4e);
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + 0x4e;
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x3e] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x3f] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x40] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x41] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x42] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x43] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x44] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x45] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x46] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x47] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x48] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x49] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x4a] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x4b] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x4c] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x4d] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x30] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x31] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x32] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x33] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x34] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x35] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x36] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x37] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x38] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x39] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x3a] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x3b] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x3c] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x3d] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x3e] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x3f] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x20] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x21] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x22] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x23] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x24] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x25] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x26] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x27] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x28] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x29] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x2a] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x2b] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x2c] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x2d] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x2e] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x2f] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x10] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x11] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x12] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x13] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x14] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x15] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x16] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x17] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x18] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x19] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1a] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1b] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1c] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1d] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1e] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1f] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[1] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[2] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[3] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[4] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[5] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[6] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[7] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[8] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[9] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[10] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xb] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xc] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xd] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xe] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xf] = '\0';
    local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    ret = bip32_key_serialize(local_f0,1,
                              local_228.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,0x4e);
    if (ret == 0) {
      ByteData::ByteData((ByteData *)&local_278,&local_228);
      puVar1 = (this->serialize_data_).data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      (this->serialize_data_).data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_278._M_dataplus._M_p;
      (this->serialize_data_).data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_278._M_string_length;
      (this->serialize_data_).data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_278.field_2._M_allocated_capacity;
      local_278._M_dataplus._M_p = (pointer)0x0;
      local_278._M_string_length = 0;
      local_278.field_2._M_allocated_capacity = 0;
      if (puVar1 != (pointer)0x0) {
        operator_delete(puVar1);
        if ((pointer)local_278._M_dataplus._M_p != (pointer)0x0) {
          operator_delete(local_278._M_dataplus._M_p);
        }
      }
      ByteData256::ByteData256((ByteData256 *)&local_278);
      puVar1 = (this->tweak_sum_).data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      (this->tweak_sum_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)local_278._M_dataplus._M_p;
      (this->tweak_sum_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)local_278._M_string_length;
      (this->tweak_sum_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)local_278.field_2._M_allocated_capacity;
      local_278._M_dataplus._M_p = (pointer)0x0;
      local_278._M_string_length = 0;
      local_278.field_2._M_allocated_capacity = 0;
      if (puVar1 != (pointer)0x0) {
        operator_delete(puVar1);
        if (local_278._M_dataplus._M_p != (pointer)0x0) {
          operator_delete(local_278._M_dataplus._M_p);
        }
      }
      AnalyzeBip32KeyData(local_f0,(string *)0x0,
                          (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0,
                          &this->version_,&this->depth_,&this->child_num_,local_230,(Privkey *)0x0,
                          local_238,&this->fingerprint_);
      if (local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (chain_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(chain_bytes.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (pubkey_hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(pubkey_hash.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(pubkey_bytes.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_258.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_258.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      return;
    }
    local_278._M_dataplus._M_p = "cfdcore_hdwallet.cpp";
    local_278._M_string_length = CONCAT44(local_278._M_string_length._4_4_,0x362);
    local_278.field_2._M_allocated_capacity = (long)"GetExtPubkey" + 3;
    logger::log<int&>((CfdSourceLocation *)&local_278,kCfdLogLevelWarning,
                      "bip32_key_serialize error. ret={}",&ret);
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_278,"ExtPrivkey serialize error.","");
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&local_278);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_278._M_dataplus._M_p = "cfdcore_hdwallet.cpp";
  local_278._M_string_length = CONCAT44(local_278._M_string_length._4_4_,0x359);
  local_278.field_2._M_allocated_capacity = (long)"GetExtPubkey" + 3;
  logger::log<int&>((CfdSourceLocation *)&local_278,kCfdLogLevelWarning,
                    "bip32_key_from_parent error. ret={}",&ret);
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_278,"ExtPubkey generatekey error.","");
  CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&local_278);
  __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ExtPubkey::ExtPubkey(
    NetType network_type, const Pubkey& parent_key,
    const ByteData256& parent_chain_code, uint8_t parent_depth,
    uint32_t child_num) {
  if (!parent_key.IsValid()) {
    warn(CFD_LOG_SOURCE, "invalid pubkey.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to pubkey. ExtPubkey invalid pubkey.");
  }
  Pubkey key = parent_key;
  if (!key.IsCompress()) {
    key = key.Compress();
  }

  // create simple parent data
  struct ext_key parent = {};
  memset(&parent, 0, sizeof(parent));
  parent.version = kVersionTestnetPubkey;
  if ((network_type == NetType::kMainnet) ||
      (network_type == NetType::kLiquidV1)) {
    parent.version = kVersionMainnetPubkey;
  }
  parent.depth = parent_depth;
  parent.priv_key[0] = BIP32_FLAG_KEY_PUBLIC;
  std::vector<uint8_t> pubkey_bytes = key.GetData().GetBytes();
  std::vector<uint8_t> pubkey_hash = HashUtil::Hash160(key).GetBytes();
  std::vector<uint8_t> chain_bytes = parent_chain_code.GetData().GetBytes();
  memcpy(parent.pub_key, pubkey_bytes.data(), pubkey_bytes.size());
  memcpy(parent.hash160, pubkey_hash.data(), pubkey_hash.size());
  memcpy(parent.chain_code, chain_bytes.data(), chain_bytes.size());

  struct ext_key extkey = {};
  memset(&extkey, 0, sizeof(extkey));
  int ret = bip32_key_from_parent(
      &parent, child_num, BIP32_FLAG_KEY_PUBLIC, &extkey);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "bip32_key_from_parent error. ret={}", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "ExtPubkey generatekey error.");
  }

  std::vector<uint8_t> data(BIP32_SERIALIZED_LEN);
  ret = bip32_key_serialize(
      &extkey, BIP32_FLAG_KEY_PUBLIC, data.data(), data.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "bip32_key_serialize error. ret={}", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "ExtPrivkey serialize error.");
  }
  serialize_data_ = ByteData(data);
  tweak_sum_ = ByteData256();

  AnalyzeBip32KeyData(
      &extkey, nullptr, nullptr, &version_, &depth_, &child_num_, &chaincode_,
      nullptr, &pubkey_, &fingerprint_);
}